

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoProvider.cpp
# Opt level: O2

void InfoProvider::initGPUCount(void)

{
  reference this;
  QArrayDataPointer<char16_t> *other;
  long lVar1;
  int i;
  long i_00;
  QArrayDataPointer<char16_t> QStack_88;
  QArrayDataPointer<char16_t> local_70;
  QStringList names;
  QArrayDataPointer<char16_t> local_40;
  
  QString::QString((QString *)&local_40,"nvidia-smi --query-gpu=count --format=csv,noheader");
  Utils::exec((QString *)&local_70,(QString *)&local_40);
  QString::QString((QString *)&QStack_88,"\n");
  QString::split(&names,&local_70,&QStack_88,0,1);
  this = QList<QString>::operator[](&names,0);
  m_gpuCount = QString::toInt(this,(bool *)0x0,10);
  QArrayDataPointer<QString>::~QArrayDataPointer(&names.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QVarLengthArray<QString,_256LL>::resize(&m_gpuNames,(long)m_gpuCount);
  QString::QString((QString *)&local_40,"nvidia-smi --query-gpu=name --format=csv,noheader");
  Utils::exec((QString *)&local_70,(QString *)&local_40);
  QString::QString((QString *)&QStack_88,"\n");
  QString::split(&names,&local_70,&QStack_88,0,1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  lVar1 = 0;
  for (i_00 = 0; i_00 < m_gpuCount; i_00 = i_00 + 1) {
    other = &QList<QString>::operator[](&names,i_00)->d;
    QArrayDataPointer<char16_t>::swap
              ((QArrayDataPointer<char16_t> *)((long)&((m_gpuNames.ptr)->d).d + lVar1),other);
    lVar1 = lVar1 + 0x18;
  }
  QVarLengthArray<InfoProvider::GPUInfo,_256LL>::resize(&m_info,(long)m_gpuCount);
  QArrayDataPointer<QString>::~QArrayDataPointer(&names.d);
  return;
}

Assistant:

void InfoProvider::initGPUCount() {
    m_gpuCount = exec_cmd("nvidia-smi --query-gpu=count --format=csv,noheader").split("\n")[0].toInt();
    m_gpuNames.resize(m_gpuCount);

    auto names = exec_cmd("nvidia-smi --query-gpu=name --format=csv,noheader").split("\n");

    for (int i = 0; i < m_gpuCount; i++)
        m_gpuNames[i] = std::move(names[i]);

    m_info.resize(m_gpuCount);
}